

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void visualizeClassicSudoku(SudokuGitter *gitter)

{
  allocator local_b1;
  string local_b0 [48];
  SudokuGitter local_80;
  undefined1 local_58 [8];
  ClassicSudokuVisualizer visualizer;
  SudokuGitter *gitter_local;
  
  visualizer._64_8_ = gitter;
  SudokuGitter::SudokuGitter(&local_80,gitter);
  ClassicSudokuVisualizer::ClassicSudokuVisualizer((ClassicSudokuVisualizer *)local_58,&local_80);
  SudokuGitter::~SudokuGitter(&local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"output/classic.html",&local_b1);
  ClassicSudokuVisualizer::createHTML((ClassicSudokuVisualizer *)local_58,(string *)local_b0);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  ClassicSudokuVisualizer::~ClassicSudokuVisualizer((ClassicSudokuVisualizer *)local_58);
  return;
}

Assistant:

void visualizeClassicSudoku(SudokuGitter gitter){
    ClassicSudokuVisualizer visualizer = ClassicSudokuVisualizer(gitter);
    visualizer.createHTML("output/classic.html");
}